

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::removeNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *pMVar3;
  
  pMVar1 = this->head_;
  if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
    return (MemoryLeakDetectorNode *)0x0;
  }
  if (*(char **)(pMVar1 + 0x10) == memory) {
    pMVar2 = (MemoryLeakDetectorNode *)0x0;
  }
  else {
    do {
      pMVar2 = pMVar1;
      pMVar1 = *(MemoryLeakDetectorNode **)(pMVar2 + 0x38);
      if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
        return (MemoryLeakDetectorNode *)0x0;
      }
    } while (*(char **)(pMVar1 + 0x10) != memory);
  }
  pMVar3 = pMVar2 + 0x38;
  if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
    pMVar3 = (MemoryLeakDetectorNode *)this;
  }
  *(undefined8 *)pMVar3 = *(undefined8 *)(pMVar1 + 0x38);
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::removeNode(char* memory)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;
    while (cur) {
        if (cur->memory_ == memory) {
            if (prev) {
                prev->next_ = cur->next_;
                return cur;
            }
            else {
                head_ = cur->next_;
                return cur;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
    return NULLPTR;
}